

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::splitFacesFromVerticalRow<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  int iVar1;
  ulong uVar2;
  CubemapFace<unsigned_char> *pCVar3;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = (int)(_height / 6);
  iVar8 = (int)_width;
  uVar2 = (long)(((ulong)(uint)(iVar1 * iVar8) << 0x20) * 3) >> 0x20;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)uVar2) {
    uVar5 = uVar2;
  }
  lVar6 = 0;
  do {
    pCVar3 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar3->id = 0;
    pCVar3->width = 0;
    pCVar3->height = 0;
    pCVar3->currentOffset = 0;
    pCVar3->data = (uchar *)0x0;
    _faces[lVar6] = pCVar3;
    pCVar3->id = (int)lVar6;
    puVar4 = (uchar *)operator_new__(uVar5);
    pCVar3->data = puVar4;
    pCVar3->width = iVar8;
    pCVar3->height = iVar1;
    pCVar3->currentOffset = 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  if (_height != 0) {
    lVar6 = _width * 0x300000000;
    lVar10 = 0;
    uVar5 = 0;
    do {
      lVar7 = 6;
      lVar9 = lVar10;
      do {
        pCVar3 = _faces[(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                             / (long)iVar1)];
        if (pCVar3 != (CubemapFace<unsigned_char> *)0x0) {
          memcpy(pCVar3->data + pCVar3->currentOffset,_data + (lVar9 >> 0x20),lVar6 >> 0x20);
          pCVar3->currentOffset = pCVar3->currentOffset + iVar8 * 3;
        }
        lVar9 = lVar9 + lVar6;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      uVar5 = uVar5 + 1;
      lVar10 = lVar10 + lVar6;
    } while (uVar5 != _height);
  }
  return;
}

Assistant:

void splitFacesFromVerticalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width;
    int faceHeight = _height/6;


    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 j      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[jFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}